

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O0

bool __thiscall SQTable::NewSlot(SQTable *this,SQObjectPtr *key,SQObjectPtr *val)

{
  _HashNode *p_Var1;
  SQHash SVar2;
  SQObjectPtr *val_00;
  _HashNode *p_Var3;
  SQObjectPtr *in_RDX;
  SQTable *in_RSI;
  SQTable *in_RDI;
  _HashNode *othern;
  SQHash mph;
  _HashNode *mp;
  _HashNode *n;
  SQHash h;
  _HashNode *in_stack_ffffffffffffffb8;
  SQObjectPtr *in_stack_ffffffffffffffc0;
  SQTable *this_00;
  bool local_1;
  
  this_00 = in_RDI;
  SVar2 = HashObj((SQObjectPtr *)in_RSI);
  val_00 = (SQObjectPtr *)(SVar2 & in_RDI->_numofnodes - 1U);
  p_Var3 = _Get(in_RDI,(SQObjectPtr *)in_RSI,(SQHash)val_00);
  if (p_Var3 == (_HashNode *)0x0) {
    p_Var3 = in_RDI->_nodes + (long)val_00;
    if ((p_Var3->key).super_SQObject._type != OT_NULL) {
      p_Var1 = in_RDI->_firstfree;
      SVar2 = HashObj(&p_Var3->key);
      in_stack_ffffffffffffffc0 = (SQObjectPtr *)(SVar2 & in_RDI->_numofnodes - 1U);
      if ((p_Var1 < p_Var3) &&
         (in_stack_ffffffffffffffb8 = in_RDI->_nodes + (long)in_stack_ffffffffffffffc0,
         in_stack_ffffffffffffffb8 != p_Var3)) {
        for (; in_stack_ffffffffffffffb8->next != p_Var3;
            in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8->next) {
        }
        in_stack_ffffffffffffffb8->next = p_Var1;
        ::SQObjectPtr::operator=(in_stack_ffffffffffffffc0,&in_stack_ffffffffffffffb8->val);
        ::SQObjectPtr::operator=(in_stack_ffffffffffffffc0,&in_stack_ffffffffffffffb8->val);
        p_Var1->next = p_Var3->next;
        ::SQObjectPtr::Null((SQObjectPtr *)in_RDI);
        ::SQObjectPtr::Null((SQObjectPtr *)in_RDI);
        p_Var3->next = (_HashNode *)0x0;
      }
      else {
        p_Var1->next = p_Var3->next;
        p_Var3->next = p_Var1;
      }
    }
    ::SQObjectPtr::operator=(in_stack_ffffffffffffffc0,&in_stack_ffffffffffffffb8->val);
    while( true ) {
      if (((in_RDI->_firstfree->key).super_SQObject._type == OT_NULL) &&
         (in_RDI->_firstfree->next == (_HashNode *)0x0)) {
        ::SQObjectPtr::operator=(in_stack_ffffffffffffffc0,&in_stack_ffffffffffffffb8->val);
        in_RDI->_usednodes = in_RDI->_usednodes + 1;
        return true;
      }
      if (in_RDI->_firstfree == in_RDI->_nodes) break;
      in_RDI->_firstfree = in_RDI->_firstfree + -1;
    }
    Rehash(this_00,SUB81((ulong)in_RSI >> 0x38,0));
    local_1 = NewSlot(in_RSI,in_RDX,val_00);
  }
  else {
    ::SQObjectPtr::operator=(in_stack_ffffffffffffffc0,&in_stack_ffffffffffffffb8->val);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SQTable::NewSlot(const SQObjectPtr &key,const SQObjectPtr &val)
{
    assert(type(key) != OT_NULL);
    SQHash h = HashObj(key) & (_numofnodes - 1);
    _HashNode *n = _Get(key, h);
    if (n) {
        n->val = val;
        return false;
    }
    _HashNode *mp = &_nodes[h];
    n = mp;


    //key not found I'll insert it
    //main pos is not free

    if(type(mp->key) != OT_NULL) {
        n = _firstfree;  /* get a free place */
        SQHash mph = HashObj(mp->key) & (_numofnodes - 1);
        _HashNode *othern;  /* main position of colliding node */

        if (mp > n && (othern = &_nodes[mph]) != mp){
            /* yes; move colliding node into free position */
            while (othern->next != mp){
                assert(othern->next != NULL);
                othern = othern->next;  /* find previous */
            }
            othern->next = n;  /* redo the chain with `n' in place of `mp' */
            n->key = mp->key;
            n->val = mp->val;/* copy colliding node into free pos. (mp->next also goes) */
            n->next = mp->next;
            mp->key.Null();
            mp->val.Null();
            mp->next = NULL;  /* now `mp' is free */
        }
        else{
            /* new node will go into free position */
            n->next = mp->next;  /* chain new position */
            mp->next = n;
            mp = n;
        }
    }
    mp->key = key;

    for (;;) {  /* correct `firstfree' */
        if (type(_firstfree->key) == OT_NULL && _firstfree->next == NULL) {
            mp->val = val;
            _usednodes++;
            return true;  /* OK; table still has a free place */
        }
        else if (_firstfree == _nodes) break;  /* cannot decrement from here */
        else (_firstfree)--;
    }
    Rehash(true);
    return NewSlot(key, val);
}